

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  uint uVar1;
  int iVar2;
  ImDrawListSharedData *pIVar3;
  ImDrawCmd *__src;
  uint *__src_00;
  ImDrawVert *__src_01;
  ImDrawList *__s;
  ImDrawCmd *__dest;
  uint *puVar4;
  ImDrawVert *pIVar5;
  int iVar6;
  ulong uVar7;
  
  __s = (ImDrawList *)ImGui::MemAlloc(0xc0);
  pIVar3 = this->_Data;
  __dest = (ImDrawCmd *)0x0;
  memset(__s,0,0xc0);
  __s->_Data = pIVar3;
  uVar1 = (this->CmdBuffer).Size;
  if (0 < (long)(int)uVar1) {
    uVar7 = 8;
    if (8 < uVar1) {
      uVar7 = (ulong)uVar1;
    }
    __dest = (ImDrawCmd *)ImGui::MemAlloc(uVar7 * 0x38);
    __src = (__s->CmdBuffer).Data;
    if (__src != (ImDrawCmd *)0x0) {
      memcpy(__dest,__src,(long)(__s->CmdBuffer).Size * 0x38);
      ImGui::MemFree((__s->CmdBuffer).Data);
    }
    (__s->CmdBuffer).Data = __dest;
    (__s->CmdBuffer).Capacity = (int)uVar7;
  }
  (__s->CmdBuffer).Size = uVar1;
  memcpy(__dest,(this->CmdBuffer).Data,(long)(int)uVar1 * 0x38);
  puVar4 = (__s->IdxBuffer).Data;
  if (puVar4 != (uint *)0x0) {
    (__s->IdxBuffer).Size = 0;
    (__s->IdxBuffer).Capacity = 0;
    ImGui::MemFree(puVar4);
    (__s->IdxBuffer).Data = (uint *)0x0;
  }
  iVar2 = (this->IdxBuffer).Size;
  iVar6 = (__s->IdxBuffer).Capacity;
  if (iVar6 < iVar2) {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar2) {
      iVar6 = iVar2;
    }
    puVar4 = (uint *)ImGui::MemAlloc((long)iVar6 << 2);
    __src_00 = (__s->IdxBuffer).Data;
    if (__src_00 != (uint *)0x0) {
      memcpy(puVar4,__src_00,(long)(__s->IdxBuffer).Size << 2);
      ImGui::MemFree((__s->IdxBuffer).Data);
    }
    (__s->IdxBuffer).Data = puVar4;
    (__s->IdxBuffer).Capacity = iVar6;
  }
  else {
    puVar4 = (uint *)0x0;
  }
  (__s->IdxBuffer).Size = iVar2;
  memcpy(puVar4,(this->IdxBuffer).Data,(long)iVar2 << 2);
  pIVar5 = (__s->VtxBuffer).Data;
  if (pIVar5 != (ImDrawVert *)0x0) {
    (__s->VtxBuffer).Size = 0;
    (__s->VtxBuffer).Capacity = 0;
    ImGui::MemFree(pIVar5);
    (__s->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  iVar2 = (this->VtxBuffer).Size;
  iVar6 = (__s->VtxBuffer).Capacity;
  if (iVar6 < iVar2) {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar2) {
      iVar6 = iVar2;
    }
    pIVar5 = (ImDrawVert *)ImGui::MemAlloc((long)iVar6 * 0x14);
    __src_01 = (__s->VtxBuffer).Data;
    if (__src_01 != (ImDrawVert *)0x0) {
      memcpy(pIVar5,__src_01,(long)(__s->VtxBuffer).Size * 0x14);
      ImGui::MemFree((__s->VtxBuffer).Data);
    }
    (__s->VtxBuffer).Data = pIVar5;
    (__s->VtxBuffer).Capacity = iVar6;
  }
  else {
    pIVar5 = (ImDrawVert *)0x0;
  }
  (__s->VtxBuffer).Size = iVar2;
  memcpy(pIVar5,(this->VtxBuffer).Data,(long)iVar2 * 0x14);
  __s->Flags = this->Flags;
  return __s;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}